

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_notifications.cpp
# Opt level: O2

InterruptResult * __thiscall
node::KernelNotifications::blockTip
          (InterruptResult *__return_storage_ptr__,KernelNotifications *this,
          SynchronizationState state,CBlockIndex *index)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  Logger *pLVar3;
  undefined4 in_register_00000014;
  InterruptResult *pIVar4;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string local_60;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CClientUIInterface::NotifyBlockTip
            ((CClientUIInterface *)&uiInterface,(SynchronizationState)this,
             (CBlockIndex *)CONCAT44(in_register_00000014,state));
  pIVar4 = (InterruptResult *)0x0;
  if ((*(int *)(__return_storage_ptr__ + 4) != 0) &&
     (*(int *)(__return_storage_ptr__ + 4) <=
      ((CBlockIndex *)CONCAT44(in_register_00000014,state))->nHeight)) {
    bVar2 = util::SignalInterrupt::operator()(*(SignalInterrupt **)(__return_storage_ptr__ + 8));
    pIVar4 = (InterruptResult *)0x100;
    if (!bVar2) {
      pLVar3 = LogInstance();
      bVar2 = BCLog::Logger::Enabled(pLVar3);
      if (bVar2) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::format<>
                  (&local_60,"Failed to send shutdown signal after reaching stop height\n");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        pLVar3 = LogInstance();
        local_60._M_dataplus._M_p = (pointer)0x66;
        local_60._M_string_length = 0x6bb956;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/kernel_notifications.cpp"
        ;
        source_file._M_len = 0x66;
        str._M_str = log_msg._M_dataplus._M_p;
        str._M_len = log_msg._M_string_length;
        logging_function._M_str = "blockTip";
        logging_function._M_len = 8;
        BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x38,ALL,Error);
        std::__cxx11::string::~string((string *)&log_msg);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pIVar4;
  }
  __stack_chk_fail();
}

Assistant:

kernel::InterruptResult KernelNotifications::blockTip(SynchronizationState state, CBlockIndex& index)
{
    uiInterface.NotifyBlockTip(state, &index);
    if (m_stop_at_height && index.nHeight >= m_stop_at_height) {
        if (!m_shutdown()) {
            LogError("Failed to send shutdown signal after reaching stop height\n");
        }
        return kernel::Interrupted{};
    }
    return {};
}